

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.c
# Opt level: O2

Card * card_createFromId(char *id)

{
  int iVar1;
  undefined8 in_RAX;
  size_t sVar2;
  Card *pCVar3;
  SUIT suit;
  char cVar4;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)CONCAT15(*id,(int5)in_RAX);
  cVar4 = id[1];
  sVar2 = strlen(id);
  if (sVar2 == 3) {
    uStack_18._0_7_ = CONCAT16(cVar4,(undefined6)uStack_18);
    cVar4 = id[2];
  }
  iVar1 = atoi((char *)((long)&uStack_18 + 5));
  if (cVar4 == 'c') {
    suit = CLUB;
  }
  else {
    suit = SPADE;
    if (cVar4 != 's') {
      suit = (cVar4 == 'h') + DIAMOND;
    }
  }
  pCVar3 = card_create((uchar)iVar1,suit,true);
  return pCVar3;
}

Assistant:

Card * card_createFromId(char * id)
{
	char rank[3] = {0, 0, 0};
	rank[0] = id[0];
	char suit = id[1];

	if(strlen(id)==3)
	{
		rank[1] = id[1];
		suit = id[2];
	}

	return card_create(atoi(rank), (suit=='s' ? SPADE : (suit=='c' ? CLUB : (suit=='h' ? HEART : DIAMOND))), true);
}